

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

ProString * __thiscall
VcprojGenerator::firstInputFileName
          (ProString *__return_storage_ptr__,VcprojGenerator *this,ProString *extraCompilerName)

{
  QMakeProject *this_00;
  long lVar1;
  QList<ProString> *this_01;
  iterator variableName;
  iterator iVar2;
  ProStringList *pPVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_78;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  local_78.b = (char (*) [7])0x2a6971;
  local_78.a = extraCompilerName;
  ProString::ProString<ProString_const&,char_const(&)[7]>(&local_68,&local_78);
  this_01 = &QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)&local_68)->
             super_QList<ProString>;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  variableName = QList<ProString>::begin(this_01);
  iVar2 = QList<ProString>::end(this_01);
  bVar4 = variableName.i == iVar2.i;
  if (!bVar4) {
    pPVar3 = QMakeEvaluator::valuesRef
                       (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.project)->
                         super_QMakeEvaluator,(ProKey *)variableName.i);
    lVar1 = (pPVar3->super_QList<ProString>).d.size;
    while (lVar1 == 0) {
      variableName.i = variableName.i + 1;
      bVar4 = variableName.i == iVar2.i;
      if (bVar4) goto LAB_00237ab4;
      pPVar3 = QMakeEvaluator::valuesRef
                         (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.project)->
                           super_QMakeEvaluator,(ProKey *)variableName.i);
      lVar1 = (pPVar3->super_QList<ProString>).d.size;
    }
    ProString::ProString(__return_storage_ptr__,(pPVar3->super_QList<ProString>).d.ptr);
    if (!bVar4) goto LAB_00237abc;
  }
LAB_00237ab4:
  ProString::ProString(__return_storage_ptr__);
LAB_00237abc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString VcprojGenerator::firstInputFileName(const ProString &extraCompilerName) const
{
    for (const ProString &var : project->values(ProKey(extraCompilerName + ".input"))) {
        const ProStringList &files = project->values(var.toKey());
        if (!files.isEmpty())
            return files.first();
    }
    return ProString();
}